

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::detail::AtMatcher<iutest::detail::GtMatcher<int>>::operator()
          (AssertionResult *__return_storage_ptr__,AtMatcher<iutest::detail::GtMatcher<int>> *this,
          vector<int,_std::allocator<int>_> *actual)

{
  AssertionResult *rhs;
  AssertionResult AStack_98;
  AssertionResult local_70;
  AssertionResult local_48;
  
  GtMatcher<int>::operator()
            (&local_48,(GtMatcher<int> *)(this + 0x10),
             (actual->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start + *(long *)(this + 8));
  AssertionResult::operator!(&AStack_98,&local_48);
  AssertionResult::operator!(&local_70,&AStack_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&AStack_98);
  std::__cxx11::string::~string((string *)&local_48);
  if (local_70.m_result == true) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_70.m_message._M_dataplus._M_p = (pointer)&local_70.m_message.field_2;
    local_70.m_message._M_string_length = 0;
    local_70.m_message.field_2._M_local_buf[0] = '\0';
    local_70.m_result = false;
    WhichIs_abi_cxx11_(&AStack_98.m_message,this);
    rhs = AssertionResult::operator<<(&local_70,&AStack_98.m_message);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&AStack_98);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( CastToMatcher(m_expected)(actual[m_index]) )
        {
            return AssertionSuccess();
        }